

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall
Analyser_overconstrainedNlaSystem_Test::TestBody(Analyser_overconstrainedNlaSystem_Test *this)

{
  void *pvVar1;
  undefined8 uVar2;
  char cVar3;
  long *plVar4;
  char *pcVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_970;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  AssertionResult gtest_ar;
  AnalyserPtr analyser;
  ModelPtr model;
  ParserPtr parser;
  ScopedTrace local_121;
  long *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  long local_110;
  undefined1 local_108 [32];
  Type local_e8;
  undefined4 uStack_e4;
  long local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  shared_ptr *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  shared_ptr *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long *local_50 [2];
  long local_40 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  libcellml::Parser::create(SUB81(local_60,0));
  local_108._0_8_ = (pointer)(local_108 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,"analyser/overconstrained_nla_system.cellml","");
  fileContents((string *)&local_d0);
  libcellml::Parser::parseModel(local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_108._16_8_)->_M_p + 1));
  }
  local_108._0_8_ = (pointer)0x0;
  local_120 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_d0,"size_t(0)","parser->issueCount()",(unsigned_long *)local_108,
             (unsigned_long *)&local_120);
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_108);
    if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x3ba,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((pointer)local_108._0_8_ != (pointer)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((pointer)local_108._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_108._0_8_)->_M_p + 8))();
      }
      local_108._0_8_ = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "Variable \'y\' in component \'my_algebraic_system\' is computed more than once.","");
  plVar4 = local_a0;
  local_b0[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,
             "Variable \'x\' in component \'my_algebraic_system\' is computed more than once.","");
  __l._M_len = 2;
  __l._M_array = &local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_108,__l,(allocator_type *)&local_120);
  lVar6 = -0x40;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel(local_90);
  testing::ScopedTrace::ScopedTrace
            (&local_121,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
             ,0x3ca,"Issue occurred here.");
  expectedCellmlElementTypes
            ((ulong)&local_d0,(CellmlElementType)((long)(local_108._8_8_ - local_108._0_8_) >> 5));
  expectedLevels((ulong)&local_120,(Level)((long)(local_108._8_8_ - local_108._0_8_) >> 5));
  expectedReferenceRules
            ((ulong)&local_e8,(ReferenceRule)((long)(local_108._8_8_ - local_108._0_8_) >> 5));
  uVar2 = local_108._0_8_;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE"
             ,"");
  expectedUrls(&local_30,(long)(local_108._8_8_ - uVar2) >> 5,local_50);
  local_80 = local_90;
  local_78 = local_88;
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
    }
  }
  expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls
            ((vector *)local_108,(vector *)&local_d0,(vector *)&local_120,(vector *)&local_e8,
             (vector *)&local_30,(shared_ptr *)&local_80);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pvVar1 = (void *)CONCAT44(uStack_e4,local_e8);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_d8 - (long)pvVar1);
  }
  if (local_120 != (long *)0x0) {
    operator_delete(local_120,local_110 - (long)local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_d0._M_dataplus._M_p,
                    local_d0.field_2._M_allocated_capacity - (long)local_d0._M_dataplus._M_p);
  }
  local_e8 = OVERCONSTRAINED;
  libcellml::Analyser::model();
  local_30.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = libcellml::AnalyserModel::type();
  testing::internal::CmpHelperEQ<libcellml::AnalyserModel::Type,libcellml::AnalyserModel::Type>
            ((internal *)&local_d0,"libcellml::AnalyserModel::Type::OVERCONSTRAINED",
             "analyser->model()->type()",&local_e8,(Type *)&local_30);
  if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
  }
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_120);
    if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x3cc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_120 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_120 != (long *)0x0)) {
        (**(code **)(*local_120 + 8))();
      }
      local_120 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::ScopedTrace::~ScopedTrace(&local_121);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_108);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

TEST(Analyser, overconstrainedNlaSystem)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/overconstrained_nla_system.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "Variable 'y' in component 'my_algebraic_system' is computed more than once.",
        "Variable 'x' in component 'my_algebraic_system' is computed more than once.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES_CELLMLELEMENTTYPES_LEVELS_REFERENCERULES_URLS(expectedIssues,
                                                                   expectedCellmlElementTypes(expectedIssues.size(), libcellml::CellmlElementType::VARIABLE),
                                                                   expectedLevels(expectedIssues.size(), libcellml::Issue::Level::ERROR),
                                                                   expectedReferenceRules(expectedIssues.size(), libcellml::Issue::ReferenceRule::ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE),
                                                                   expectedUrls(expectedIssues.size(), "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE"),
                                                                   analyser);

    EXPECT_EQ(libcellml::AnalyserModel::Type::OVERCONSTRAINED, analyser->model()->type());
}